

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O0

void __thiscall bandit::reporter::info::list_failures_and_errors(info *this)

{
  bool bVar1;
  ostream *poVar2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar3;
  size_type sVar4;
  string local_120 [32];
  string local_100 [32];
  reference local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *error;
  iterator __end3_1;
  iterator __begin3_1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  string local_a0 [32];
  string local_80 [32];
  reference local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *failure;
  iterator __end3;
  iterator __begin3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_30 [32];
  info *local_10;
  info *this_local;
  
  local_10 = this;
  if (0 < (this->super_colored_base).super_progress_base.specs_failed_) {
    poVar2 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])();
    poVar2 = std::operator<<(poVar2,local_30);
    poVar2 = std::operator<<(poVar2,"List of failures:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_30);
    plVar3 = &(this->super_colored_base).super_progress_base.failures_;
    __end3 = std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(plVar3);
    failure = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(plVar3);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&failure), bVar1) {
      local_60 = std::
                 _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end3);
      poVar2 = (this->super_colored_base).stm_;
      (*((this->super_colored_base).colorizer_)->_vptr_interface[6])();
      poVar2 = std::operator<<(poVar2,local_80);
      poVar2 = std::operator<<(poVar2," (*) ");
      (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(local_a0);
      poVar2 = std::operator<<(poVar2,local_a0);
      poVar2 = std::operator<<(poVar2,(string *)local_60);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_80);
      std::
      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3);
    }
  }
  sVar4 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(this->super_colored_base).super_progress_base.test_run_errors_);
  if (sVar4 != 0) {
    poVar2 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])();
    poVar2 = std::operator<<(poVar2,(string *)&__range3_1);
    poVar2 = std::operator<<(poVar2,"List of run errors:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&__range3_1);
    plVar3 = &(this->super_colored_base).super_progress_base.test_run_errors_;
    __end3_1 = std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(plVar3);
    error = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(plVar3);
    while (bVar1 = std::operator!=(&__end3_1,(_Self *)&error), bVar1) {
      local_e0 = std::
                 _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end3_1);
      poVar2 = (this->super_colored_base).stm_;
      (*((this->super_colored_base).colorizer_)->_vptr_interface[6])();
      poVar2 = std::operator<<(poVar2,local_100);
      poVar2 = std::operator<<(poVar2," (*) ");
      (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(local_120);
      poVar2 = std::operator<<(poVar2,local_120);
      poVar2 = std::operator<<(poVar2,(string *)local_e0);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_100);
      std::
      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3_1);
    }
  }
  return;
}

Assistant:

void list_failures_and_errors() {
        if (specs_failed_ > 0) {
          stm_
              << colorizer_.bad()
              << "List of failures:"
              << std::endl;
          for (const auto& failure : failures_) {
            stm_
                << colorizer_.emphasize()
                << " (*) "
                << colorizer_.bad()
                << failure << std::endl;
          }
        }
        if (test_run_errors_.size() > 0) {
          stm_
              << colorizer_.bad()
              << "List of run errors:"
              << std::endl;
          for (const auto& error : test_run_errors_) {
            stm_
                << colorizer_.emphasize()
                << " (*) "
                << colorizer_.bad()
                << error << std::endl;
          }
        }
      }